

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall
cfd::core::Address::CalculateP2WSH(Address *this,ByteData256 *hash_data,string *bech32_hrp)

{
  pointer pcVar1;
  void *pvVar2;
  int iVar3;
  uchar uVar4;
  NetType_conflict NVar5;
  CfdException *this_00;
  char *wally_string;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> segwit_data;
  string human_code;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> prefix_list;
  char *output;
  int local_bc;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  long *local_80;
  long local_78;
  long local_70 [2];
  CfdSourceLocation local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  WallyUtil *local_30;
  
  ByteData256::GetBytes(&local_48,hash_data);
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_80._0_1_ = *(string *)&this->witness_ver_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
            (&local_98,(iterator)0x0,(uchar *)&local_80);
  uVar4 = (char)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_ -
          (char)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_;
  local_80 = (long *)CONCAT71(local_80._1_7_,uVar4);
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&local_98,
               (iterator)
               local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,(uchar *)&local_80);
  }
  else {
    *local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = uVar4;
    local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  ::std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((uchar *)CONCAT44(local_48.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_48.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_),
             (uchar *)CONCAT44(local_48.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               local_48.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._0_4_),&local_98);
  pcVar1 = (bech32_hrp->_M_dataplus)._M_p;
  local_80 = local_70;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + bech32_hrp->_M_string_length);
  if ((local_78 == 0) && ((uint)this->type_ < 3)) {
    GetBitcoinAddressFormatList();
    AddressFormatData::GetBech32Hrp_abi_cxx11_
              ((string *)local_b8,
               (AddressFormatData *)(local_60.filename + (ulong)(uint)this->type_ * 0x30));
    ::std::__cxx11::string::operator=((string *)&local_80,(string *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ != &local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8._M_allocated_capacity + 1);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&this->format_data_,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_60.filename + (ulong)(uint)this->type_ * 0x30));
    NVar5 = AddressFormatData::GetNetType(&this->format_data_);
    this->type_ = NVar5;
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &local_60);
  }
  local_30 = (WallyUtil *)0x0;
  local_bc = wally_addr_segwit_from_bytes
                       (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_98.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,(char *)local_80,0,
                        (char **)&local_30);
  if (local_bc != 0) {
    local_b8._0_8_ = "cfdcore_address.cpp";
    local_b8._8_4_ = 0x435;
    local_a8._M_allocated_capacity = 0x6e5357;
    logger::log<int&>((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,
                      "wally_addr_segwit_from_bytes error. ret={}.",&local_bc);
    local_60.filename = "cfdcore_address.cpp";
    local_60.line = 0x437;
    local_60.funcname = "CalculateP2WSH";
    StringUtil::ByteToString_abi_cxx11_((string *)local_b8,(StringUtil *)&local_98,bytes);
    logger::log<std::__cxx11::string&>
              (&local_60,kCfdLogLevelInfo,"input hash={}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ != &local_a8) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._M_allocated_capacity + 1));
    }
    iVar3 = local_bc;
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b8._0_8_ = &local_a8;
    if (iVar3 != -2) {
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Segwit-address create error.","");
      CfdException::CfdException(this_00,kCfdInternalError,(string *)local_b8);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Segwit-address create error.","");
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_b8);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_b8,local_30,wally_string);
  ::std::__cxx11::string::operator=((string *)&this->address_,(string *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ != &local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar2 = (void *)CONCAT44(local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_48.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  return;
}

Assistant:

void Address::CalculateP2WSH(
    const ByteData256& hash_data, const std::string& bech32_hrp) {
  const std::vector<uint8_t>& script_hash_byte = hash_data.GetBytes();
  std::vector<uint8_t> segwit_data;

  // 0byte目にwitness_version, 1byte目にhashサイズ
  segwit_data.push_back(witness_ver_);
  segwit_data.push_back(static_cast<uint8_t>(script_hash_byte.size()));
  std::copy(
      script_hash_byte.begin(), script_hash_byte.end(),
      std::back_inserter(segwit_data));

  std::string human_code = bech32_hrp;
  if (human_code.empty() && (kMainnet <= type_) && (type_ <= kRegtest)) {
    auto prefix_list = GetBitcoinAddressFormatList();
    human_code = prefix_list[type_].GetBech32Hrp();
    format_data_ = prefix_list[type_];
    SetNetType(format_data_);
  }
  char* output = NULL;
  // segwit
  int ret = wally_addr_segwit_from_bytes(
      segwit_data.data(), segwit_data.size(), human_code.data(), 0, &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_addr_segwit_from_bytes error. ret={}.", ret);
    info(
        CFD_LOG_SOURCE, "input hash={}",
        StringUtil::ByteToString(segwit_data));
    if (ret == WALLY_EINVAL) {
      throw CfdException(
          kCfdIllegalArgumentError, "Segwit-address create error.");
    } else {
      throw CfdException(kCfdInternalError, "Segwit-address create error.");
    }
  }

  address_ = WallyUtil::ConvertStringAndFree(output);
}